

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,PortalImageInfiniteLight *p,Transform *args,
          Image *args_1,RGBColorSpace **args_2,float *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_5,
          polymorphic_allocator<std::byte> *args_6)

{
  Float scale;
  RGBColorSpace *imageColorSpace;
  undefined1 auVar1 [16];
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_160;
  undefined1 local_148 [200];
  size_t sStack_80;
  size_t local_78;
  polymorphic_allocator<pbrt::Half> local_70;
  undefined1 local_68 [16];
  size_t local_58;
  polymorphic_allocator<float> local_50;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_148._8_4_ = (args_1->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_148._0_4_ = args_1->format;
  local_148._4_4_ = (args_1->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_148 + 0x10),&args_1->channelNames);
  local_148._176_8_ =
       (args_1->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  local_148._184_8_ = (args_1->p8).alloc.memoryResource;
  auVar1 = ZEXT816(0) << 0x20;
  local_78 = (args_1->p8).nStored;
  local_148._192_8_ = (args_1->p8).ptr;
  sStack_80 = (args_1->p8).nAlloc;
  (args_1->p8).nStored = 0;
  (args_1->p8).ptr = (uchar *)auVar1._0_8_;
  (args_1->p8).nAlloc = auVar1._8_8_;
  local_70.memoryResource = (args_1->p16).alloc.memoryResource;
  local_58 = (args_1->p16).nStored;
  local_68._0_8_ = (args_1->p16).ptr;
  local_68._8_8_ = (args_1->p16).nAlloc;
  (args_1->p16).nStored = 0;
  (args_1->p16).ptr = (Half *)auVar1._0_8_;
  (args_1->p16).nAlloc = auVar1._8_8_;
  local_50.memoryResource = (args_1->p32).alloc.memoryResource;
  local_38 = (args_1->p32).nStored;
  local_48._0_8_ = (args_1->p32).ptr;
  local_48._8_8_ = (args_1->p32).nAlloc;
  (args_1->p32).nStored = 0;
  (args_1->p32).ptr = (float *)auVar1._0_8_;
  (args_1->p32).nAlloc = auVar1._8_8_;
  imageColorSpace = *args_2;
  scale = *args_3;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector(&local_160,args_5)
  ;
  pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
            (p,args,(Image *)local_148,imageColorSpace,scale,args_4,&local_160,
             args_6->memoryResource);
  if (local_160.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_38 = 0;
  (*(local_50.memoryResource)->_vptr_memory_resource[3])
            (local_50.memoryResource,local_48._0_8_,local_48._8_8_ << 2,4);
  local_58 = 0;
  (*(local_70.memoryResource)->_vptr_memory_resource[3])
            (local_70.memoryResource,local_68._0_8_,local_68._8_8_ * 2,2);
  local_78 = 0;
  (*(*(_func_int ***)local_148._184_8_)[3])(local_148._184_8_,local_148._192_8_,sStack_80,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_148 + 0x10));
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }